

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O2

void __thiscall Assimp::MD5::MD5Parser::MD5Parser(MD5Parser *this,char *_buffer,uint _fileSize)

{
  bool bVar1;
  Logger *pLVar2;
  char szBuffer [128];
  
  (this->mSections).super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSections).super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSections).super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((_buffer != (char *)0x0) && (_fileSize != 0)) {
    this->buffer = _buffer;
    this->fileSize = _fileSize;
    this->lineNumber = 0;
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"MD5Parser begin");
    ParseHeader(this);
    do {
      szBuffer[0x28] = '\0';
      szBuffer[0x29] = '\0';
      szBuffer[0x2a] = '\0';
      szBuffer[0x2b] = '\0';
      szBuffer[0x2c] = '\0';
      szBuffer[0x2d] = '\0';
      szBuffer[0x2e] = '\0';
      szBuffer[0x2f] = '\0';
      szBuffer[0x38] = '\0';
      szBuffer[0x39] = '\0';
      szBuffer[0x3a] = '\0';
      szBuffer[0x3b] = '\0';
      szBuffer[0x3c] = '\0';
      szBuffer[0x3d] = '\0';
      szBuffer[0x3e] = '\0';
      szBuffer[0x3f] = '\0';
      szBuffer[0x48] = '\0';
      szBuffer[0x49] = '\0';
      szBuffer[0x4a] = '\0';
      szBuffer[0x4b] = '\0';
      szBuffer[0x4c] = '\0';
      szBuffer[0x4d] = '\0';
      szBuffer[0x4e] = '\0';
      szBuffer[0x4f] = '\0';
      szBuffer[0x58] = '\0';
      szBuffer[0x59] = '\0';
      szBuffer[0x5a] = '\0';
      szBuffer[0x5b] = '\0';
      szBuffer[0x5c] = '\0';
      szBuffer[0x5d] = '\0';
      szBuffer[0x5e] = '\0';
      szBuffer[0x5f] = '\0';
      szBuffer[0x10] = '\0';
      szBuffer[0x11] = '\0';
      szBuffer[0x12] = '\0';
      szBuffer[0x13] = '\0';
      szBuffer[0x14] = '\0';
      szBuffer[0x15] = '\0';
      szBuffer[0x16] = '\0';
      szBuffer[0x17] = '\0';
      szBuffer[0x18] = '\0';
      szBuffer[0x19] = '\0';
      szBuffer[0x1a] = '\0';
      szBuffer[0x1b] = '\0';
      szBuffer[0x1c] = '\0';
      szBuffer[0x1d] = '\0';
      szBuffer[0x1e] = '\0';
      szBuffer[0x1f] = '\0';
      szBuffer[0] = '\0';
      szBuffer[1] = '\0';
      szBuffer[2] = '\0';
      szBuffer[3] = '\0';
      szBuffer[4] = '\0';
      szBuffer[5] = '\0';
      szBuffer[6] = '\0';
      szBuffer[7] = '\0';
      szBuffer[8] = '\0';
      szBuffer[9] = '\0';
      szBuffer[10] = '\0';
      szBuffer[0xb] = '\0';
      szBuffer[0xc] = '\0';
      szBuffer[0xd] = '\0';
      szBuffer[0xe] = '\0';
      szBuffer[0xf] = '\0';
      szBuffer[0x30] = '\0';
      szBuffer[0x31] = '\0';
      szBuffer[0x32] = '\0';
      szBuffer[0x33] = '\0';
      szBuffer[0x34] = '\0';
      szBuffer[0x35] = '\0';
      szBuffer[0x36] = '\0';
      szBuffer[0x37] = '\0';
      szBuffer[0x50] = '\0';
      szBuffer[0x51] = '\0';
      szBuffer[0x52] = '\0';
      szBuffer[0x53] = '\0';
      szBuffer[0x54] = '\0';
      szBuffer[0x55] = '\0';
      szBuffer[0x56] = '\0';
      szBuffer[0x57] = '\0';
      szBuffer._32_8_ = szBuffer + 0x30;
      szBuffer._64_8_ = szBuffer + 0x50;
      std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::
      emplace_back<Assimp::MD5::Section>(&this->mSections,(Section *)szBuffer);
      Section::~Section((Section *)szBuffer);
      bVar1 = ParseSection(this,(this->mSections).
                                super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
    } while (bVar1);
    bVar1 = DefaultLogger::isNullLogger();
    if (!bVar1) {
      snprintf(szBuffer,0x80,"MD5Parser end. Parsed %i sections",
               ((long)(this->mSections).
                      super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->mSections).
                     super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x60 & 0xffffffff);
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,szBuffer);
    }
    return;
  }
  __assert_fail("__null != _buffer && 0 != _fileSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MD5/MD5Parser.cpp"
                ,0x42,"Assimp::MD5::MD5Parser::MD5Parser(char *, unsigned int)");
}

Assistant:

AI_WONT_RETURN void MD5Parser::ReportError (const char* error, unsigned int line)
{
    char szBuffer[1024];
    ::ai_snprintf(szBuffer, 1024, "[MD5] Line %u: %s",line,error);
    throw DeadlyImportError(szBuffer);
}